

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslatorMain.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  BytecodeTranslator translator;
  string out;
  string in;
  exception e;
  ofstream ofs;
  BytecodeTranslator local_471;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  undefined1 *local_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined7 uStack_43f;
  long *local_430 [2];
  long local_420 [63];
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  op::initMap();
  local_448 = 0;
  local_440 = 0;
  local_468 = 0;
  local_460 = 0;
  local_470 = &local_460;
  local_450 = &local_440;
  if (argc == 3) {
    std::__cxx11::string::string((string *)local_430,argv[1],(allocator *)&local_228);
    std::__cxx11::string::operator=((string *)&local_450,(string *)local_430);
    if (local_430[0] != local_420) {
      operator_delete(local_430[0],local_420[0] + 1);
    }
    std::__cxx11::string::string((string *)local_430,argv[2],(allocator *)&local_228);
    std::__cxx11::string::operator=((string *)&local_470,(string *)local_430);
    if (local_430[0] != local_420) {
      operator_delete(local_430[0],local_420[0] + 1);
    }
  }
  else {
    puts("Type input filename:");
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_450,cVar1);
    puts("Type output filename:");
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_470,cVar1);
  }
  std::ifstream::ifstream(local_430,(string *)&local_450,_S_in);
  std::ofstream::ofstream(&local_228,(string *)&local_470,_S_out);
  BytecodeTranslator::translate(&local_471,(ifstream *)local_430,(ofstream *)&local_228);
  std::ifstream::close();
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  std::ifstream::~ifstream(local_430);
  if (local_470 != &local_460) {
    operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    try {
        op::initMap();
        std::string in, out;

        if (argc == 3) {
            in = std::string(argv[1]);
            out = std::string(argv[2]);
        } else {
            printf("Type input filename:\n");
            getline(std::cin, in);
            printf("Type output filename:\n");
            getline(std::cin, out);
        }
        std::ifstream ifs(in);
        std::ofstream ofs(out);
        BytecodeTranslator translator;
        translator.translate(ifs, ofs);
        ifs.close();
        ofs.close();
    } catch (std::exception e) {
        std::cout << e.what() << '\n';
    }
    return 0;
}